

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

Vec_Int_t * Saig_RefManRefineWithSat(Saig_RefMan_t *p,Vec_Int_t *vAigPis)

{
  Aig_Man_t *pAVar1;
  Abc_Cex_t *pAVar2;
  void **ppvVar3;
  lit *begin;
  int iVar4;
  int iVar5;
  int iVar6;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  void *pvVar7;
  Vec_Int_t *vVar2PiId;
  int *piVar8;
  Vec_Int_t *p_01;
  int *piVar9;
  Vec_Ptr_t *pVVar10;
  Vec_Vec_t *__ptr;
  Vec_Int_t *p_02;
  uint uVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  
  p_00 = Cnf_DeriveSimple(p->pFrames,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_00);
    p_02 = (Vec_Int_t *)0x0;
  }
  else {
    pAVar1 = p->pAig;
    iVar5 = pAVar1->nTruePis;
    iVar4 = 0x10;
    if (0xe < iVar5 - 1U) {
      iVar4 = iVar5;
    }
    if (iVar4 == 0) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = malloc((long)iVar4 << 2);
    }
    memset(pvVar7,0,(long)iVar5 * 4);
    iVar4 = vAigPis->nSize;
    if (0 < (long)iVar4) {
      piVar8 = vAigPis->pArray;
      lVar12 = 0;
      do {
        iVar6 = piVar8[lVar12];
        if (((long)iVar6 < 0) || (pAVar1->nObjs[2] <= iVar6)) {
          __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(p->pAig)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                        ,0x2d9,"Vec_Int_t *Saig_RefManRefineWithSat(Saig_RefMan_t *, Vec_Int_t *)");
        }
        if (iVar5 <= iVar6) goto LAB_0058f357;
        *(undefined4 *)((long)pvVar7 + (long)iVar6 * 4) = 1;
        lVar12 = lVar12 + 1;
      } while (iVar4 != lVar12);
    }
    iVar4 = p_00->nVars;
    vVar2PiId = (Vec_Int_t *)malloc(0x10);
    iVar6 = iVar4;
    if (iVar4 - 1U < 0xf) {
      iVar6 = 0x10;
    }
    vVar2PiId->nSize = 0;
    vVar2PiId->nCap = iVar6;
    if (iVar6 == 0) {
      piVar8 = (int *)0x0;
    }
    else {
      piVar8 = (int *)malloc((long)iVar6 << 2);
    }
    vVar2PiId->pArray = piVar8;
    vVar2PiId->nSize = iVar4;
    memset(piVar8,0xff,(long)iVar4 << 2);
    iVar6 = p->pFrames->nObjs[2];
    p_01 = (Vec_Int_t *)malloc(0x10);
    iVar15 = 0x10;
    if (0xe < iVar6 - 1U) {
      iVar15 = iVar6;
    }
    p_01->nSize = 0;
    p_01->nCap = iVar15;
    if (iVar15 == 0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)malloc((long)iVar15 << 2);
    }
    p_01->pArray = piVar9;
    pVVar10 = p->pFrames->vCis;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      lVar18 = 0;
      do {
        lVar13 = (long)p->vMapPiF2A->nSize;
        if ((lVar13 <= lVar12) || (lVar13 <= lVar12 + 1)) goto LAB_0058f2fa;
        piVar9 = p->vMapPiF2A->pArray;
        uVar11 = piVar9[lVar12];
        if (((int)uVar11 < 0) || (iVar5 <= (int)uVar11)) goto LAB_0058f2fa;
        if (*(int *)((long)pvVar7 + (ulong)uVar11 * 4) != 0) {
          lVar13 = *(long *)((long)pVVar10->pArray + lVar12 * 4);
          pAVar2 = p->pCex;
          uVar11 = uVar11 + pAVar2->nRegs + piVar9[lVar12 + 1] * pAVar2->nPis;
          Vec_IntPush(p_01,(uint)(((uint)(&pAVar2[1].iPo)[(int)uVar11 >> 5] >> (uVar11 & 0x1f) & 1)
                                 == 0) + p_00->pVarNums[*(int *)(lVar13 + 0x24)] * 2);
          iVar6 = p_00->pVarNums[*(int *)(lVar13 + 0x24)];
          if (((long)iVar6 < 0) || (iVar4 <= iVar6)) {
LAB_0058f357:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar8[iVar6] = (int)lVar18;
        }
        lVar18 = lVar18 + 1;
        pVVar10 = p->pFrames->vCis;
        lVar12 = lVar12 + 2;
      } while (lVar18 < pVVar10->nSize);
    }
    if (pvVar7 != (void *)0x0) {
      free(pvVar7);
    }
    uVar11 = p_01->nSize;
    iVar5 = sat_solver_solve(s,p_01->pArray,p_01->pArray + (int)uVar11,1000000,0,0,0);
    pcVar14 = "SAT";
    if (iVar5 == -1) {
      pcVar14 = "UNSAT";
    }
    printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar11,pcVar14,
           (ulong)(uint)(s->stats).conflicts);
    __ptr = Saig_RefManOrderLiterals(p,vVar2PiId,p_01);
    iVar5 = __ptr->nSize;
    uVar16 = (ulong)iVar5;
    if (0 < (long)uVar16) {
      ppvVar3 = __ptr->pArray;
      uVar17 = 0;
      do {
        printf("%d ",(ulong)*(uint *)((long)ppvVar3[uVar17] + 4));
        uVar17 = uVar17 + 1;
      } while (uVar16 != uVar17);
    }
    putchar(10);
    if (0 < iVar5) {
      uVar17 = 0;
      do {
        p_01->nSize = 0;
        bVar20 = true;
        uVar19 = 0;
        do {
          if (!bVar20) goto LAB_0058f2db;
          ppvVar3 = __ptr->pArray;
          lVar12 = 0;
          while (lVar12 < *(int *)((long)ppvVar3[uVar19] + 4)) {
            if (uVar19 != uVar17) {
              Vec_IntPush(p_01,*(int *)(*(long *)((long)ppvVar3[uVar19] + 8) + lVar12 * 4));
            }
            lVar12 = lVar12 + 1;
            if (!bVar20) goto LAB_0058f2db;
          }
          uVar19 = uVar19 + 1;
          bVar20 = uVar19 < uVar16;
        } while (uVar19 != uVar16);
        uVar11 = p_01->nSize;
        iVar6 = sat_solver_solve(s,p_01->pArray,p_01->pArray + (int)uVar11,1000000,0,0,0);
        pcVar14 = "SAT";
        if (iVar6 == -1) {
          pcVar14 = "UNSAT";
        }
        printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar11,
               pcVar14,(ulong)(uint)(s->stats).conflicts);
        if (iVar6 == -1) {
          *(undefined4 *)((long)__ptr->pArray[uVar17] + 4) = 0;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar16);
    }
    if (0 < iVar5) {
      ppvVar3 = __ptr->pArray;
      uVar17 = 0;
      do {
        printf("%d ",(ulong)*(uint *)((long)ppvVar3[uVar17] + 4));
        uVar17 = uVar17 + 1;
      } while (uVar16 != uVar17);
    }
    putchar(10);
    p_01->nSize = 0;
    bVar20 = 0 < iVar5;
    if (0 < iVar5) {
      uVar17 = 0;
      do {
        if (!bVar20) {
LAB_0058f2db:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        ppvVar3 = __ptr->pArray;
        lVar12 = 0;
        while (lVar12 < *(int *)((long)ppvVar3[uVar17] + 4)) {
          Vec_IntPush(p_01,*(int *)(*(long *)((long)ppvVar3[uVar17] + 8) + lVar12 * 4));
          lVar12 = lVar12 + 1;
          if (!bVar20) goto LAB_0058f2db;
        }
        uVar17 = uVar17 + 1;
        bVar20 = uVar17 < uVar16;
      } while (uVar17 != uVar16);
    }
    begin = p_01->pArray;
    uVar11 = p_01->nSize;
    lVar12 = (long)(int)uVar11;
    iVar6 = sat_solver_solve(s,begin,begin + lVar12,1000000,0,0,0);
    pcVar14 = "SAT";
    if (iVar6 == -1) {
      pcVar14 = "UNSAT";
    }
    printf("Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n",(ulong)uVar11,pcVar14,
           (ulong)(uint)(s->stats).conflicts);
    p_02 = (Vec_Int_t *)malloc(0x10);
    p_02->nCap = 100;
    p_02->nSize = 0;
    piVar9 = (int *)malloc(400);
    p_02->pArray = piVar9;
    if (0 < lVar12) {
      lVar18 = 0;
      do {
        uVar11 = begin[lVar18] >> 1;
        if (((int)uVar11 < 0) || (iVar4 <= (int)uVar11)) {
LAB_0058f2fa:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = piVar8[uVar11];
        if ((iVar6 < 0) || (p->pFrames->nObjs[2] <= iVar6)) {
          __assert_fail("iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                        ,0x347,"Vec_Int_t *Saig_RefManRefineWithSat(Saig_RefMan_t *, Vec_Int_t *)");
        }
        Vec_IntPush(p_02,iVar6);
        lVar18 = lVar18 + 1;
      } while (lVar12 != lVar18);
    }
    Cnf_DataFree(p_00);
    sat_solver_delete(s);
    if (begin != (lit *)0x0) {
      free(begin);
      p_01->pArray = (int *)0x0;
    }
    free(p_01);
    if (piVar8 != (int *)0x0) {
      free(piVar8);
      vVar2PiId->pArray = (int *)0x0;
    }
    free(vVar2PiId);
    if (__ptr != (Vec_Vec_t *)0x0) {
      if (0 < iVar5) {
        ppvVar3 = __ptr->pArray;
        uVar17 = 0;
        do {
          pvVar7 = ppvVar3[uVar17];
          if (pvVar7 != (void *)0x0) {
            if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar7 + 8));
              *(undefined8 *)((long)pvVar7 + 8) = 0;
            }
            free(pvVar7);
          }
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
      if (__ptr->pArray != (void **)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (void **)0x0;
      }
      free(__ptr);
    }
  }
  return p_02;
}

Assistant:

Vec_Int_t * Saig_RefManRefineWithSat( Saig_RefMan_t * p, Vec_Int_t * vAigPis )
{
    int nConfLimit = 1000000;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLits;
    Vec_Int_t * vReasons, * vAssumps, * vVisited, * vVar2PiId;
    int i, k, f, Entry, RetValue, Counter;

    // create CNF and SAT solver
    pCnf = Cnf_DeriveSimple( p->pFrames, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }

    // mark used AIG inputs
    vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
    Vec_IntForEachEntry( vAigPis, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(p->pAig) );
        Vec_IntWriteEntry( vVisited, Entry, 1 );
    }

    // create assumptions
    vVar2PiId = Vec_IntStartFull( pCnf->nVars );
    vAssumps = Vec_IntAlloc( Aig_ManCiNum(p->pFrames) );
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
        int iInput = Vec_IntEntry( p->vMapPiF2A, 2*i );
        int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*i+1 );
        if ( Vec_IntEntry(vVisited, iInput) == 0 )
            continue;
        RetValue = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !RetValue ) );
//        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 ) );
        Vec_IntWriteEntry( vVar2PiId, pCnf->pVarNums[Aig_ObjId(pObj)], i );
    }
    Vec_IntFree( vVisited );

    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

/*
    // AnalizeFinal does not work because it implications propagate directly
    // and SAT solver does not kick in (the number of conflicts in 0).

    // count the number of lits in the unsat core
    {
        int nCoreLits, * pCoreLits;
        nCoreLits = sat_solver_final( pSat, &pCoreLits );
        assert( nCoreLits > 0 );

        // count the number of flops
        vVisited = Vec_IntStart( Saig_ManPiNum(p->pAig) );
        for ( i = 0; i < nCoreLits; i++ )
        {
            int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(pCoreLits[i]) );
            int iInput = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum );
            int iFrame = Vec_IntEntry( p->vMapPiF2A, 2*iPiNum+1 );
            Vec_IntWriteEntry( vVisited, iInput, 1 );
        }
        // count the number of entries
        Counter = 0;
        Vec_IntForEachEntry( vVisited, Entry, i )
            Counter += Entry;
        Vec_IntFree( vVisited );

//        if ( p->fVerbose )
        printf( "AnalizeFinal: Assumptions %d (out of %d). Essential PIs = %d. Conflicts = %d.\n", 
            nCoreLits, Vec_IntSize(vAssumps), Counter, (int)pSat->stats.conflicts );
    }
*/

    // derive literals
    vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    // create different sets of assumptions
    Counter = Vec_VecSize(vLits);
    for ( f = 0; f < Vec_VecSize(vLits); f++ )
    {
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            if ( i != f )
                Vec_IntPush( vAssumps, Entry );

        // try the new assumptions
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
            Vec_IntSize(vAssumps), RetValue == l_False ? "UNSAT" : "SAT", (int)pSat->stats.conflicts );
        if ( RetValue != l_False )
            continue;

        // UNSAT - remove literals
        Vec_IntClear( Vec_VecEntryInt(vLits, f) );
        Counter--;
    }

    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    // create assumptions
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );

    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

//    if ( p->fVerbose )
//        printf( "Total PIs = %d. Essential PIs = %d.\n", 
//            Saig_ManPiNum(p->pAig) - p->nInputs, Counter );


    // transform assumptions into reasons
    vReasons = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vAssumps, Entry, i )
    {
        int iPiNum = Vec_IntEntry( vVar2PiId, lit_var(Entry) );
        assert( iPiNum >= 0 && iPiNum < Aig_ManCiNum(p->pFrames) );
        Vec_IntPush( vReasons, iPiNum );
    }

    // cleanup
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_IntFree( vAssumps );
    Vec_IntFree( vVar2PiId );
    Vec_VecFreeP( &vLits );

    return vReasons;
}